

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cpp
# Opt level: O3

string * strStatus_abi_cxx11_
                   (string *__return_storage_ptr__,
                   vector<FileStatus,_std::allocator<FileStatus>_> *result)

{
  pointer pFVar1;
  ostream *poVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  stringstream ss;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  pFVar1 = (result->super__Vector_base<FileStatus,_std::allocator<FileStatus>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((result->super__Vector_base<FileStatus,_std::allocator<FileStatus>_>)._M_impl.
      super__Vector_impl_data._M_finish != pFVar1) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      uVar3 = (ulong)*(uint *)((long)&pFVar1->status + lVar5);
      if (uVar3 < 3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,&DAT_0010e15c + *(int *)(&DAT_0010e15c + uVar3 * 4),2);
      }
      pFVar1 = (result->super__Vector_base<FileStatus,_std::allocator<FileStatus>_>)._M_impl.
               super__Vector_impl_data._M_start;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,*(char **)((long)&(pFVar1->filename)._M_dataplus._M_p + lVar5),
                          *(long *)((long)&(pFVar1->filename)._M_string_length + lVar5));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      uVar4 = uVar4 + 1;
      pFVar1 = (result->super__Vector_base<FileStatus,_std::allocator<FileStatus>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = ((long)(result->super__Vector_base<FileStatus,_std::allocator<FileStatus>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pFVar1 >> 3) * -0x3333333333333333;
      lVar5 = lVar5 + 0x28;
    } while (uVar4 <= uVar3 && uVar3 - uVar4 != 0);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

String strStatus(Vector<FileStatus> result){
    std::stringstream ss;
    for(int i = 0; i < result.size();i++){
        switch(result[i].status){
            case added:
                ss << "A ";
                break;
            case removed:
                ss << "R ";
                break;
            case modified:
                ss << "M ";
                break;
            case none:break;
        }
        ss << result[i].filename << Endl;
    }
    return ss.str();
}